

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<true,true,true,false>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  SVOBitset *pSVar5;
  SVOBitset *other;
  HomomorphismModel *this_00;
  uint g;
  uint uVar6;
  SVOBitset check_d_values;
  
  bVar1 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,current_assignment->pattern_vertex,d->v);
  if ((bVar1 & 1) == 0) {
    pSVar5 = HomomorphismModel::forward_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::intersect_with_complement(&d->values,pSVar5);
  }
  else {
    pSVar5 = HomomorphismModel::forward_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(&d->values,pSVar5);
  }
  bVar2 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,d->v,current_assignment->pattern_vertex);
  if ((bVar2 & 1) == 0) {
    pSVar5 = HomomorphismModel::reverse_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::intersect_with_complement(&d->values,pSVar5);
  }
  else {
    pSVar5 = HomomorphismModel::reverse_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(&d->values,pSVar5);
  }
  pSVar5 = &d->values;
  uVar6 = 1;
  while( true ) {
    this_00 = this->model;
    if (this_00->max_graphs <= uVar6) break;
    if ((bVar1 >> (uVar6 & 0x1f) & 1) != 0) {
      other = HomomorphismModel::target_graph_row(this_00,uVar6,current_assignment->target_vertex);
      SVOBitset::operator&=(pSVar5,other);
    }
    uVar6 = uVar6 + 1;
  }
  if ((bVar1 & 1) != 0) {
    SVOBitset::SVOBitset(&check_d_values,pSVar5);
    iVar3 = HomomorphismModel::pattern_edge_label
                      (this->model,current_assignment->pattern_vertex,d->v);
    while( true ) {
      uVar6 = SVOBitset::find_first(&check_d_values);
      if (uVar6 == 0xffffffff) break;
      SVOBitset::reset(&check_d_values,uVar6);
      iVar4 = HomomorphismModel::target_edge_label
                        (this->model,current_assignment->target_vertex,uVar6);
      if (iVar4 != iVar3) {
        SVOBitset::reset(pSVar5,uVar6);
      }
    }
    SVOBitset::~SVOBitset(&check_d_values);
    this_00 = this->model;
  }
  bVar1 = HomomorphismModel::pattern_adjacency_bits(this_00,d->v,current_assignment->pattern_vertex)
  ;
  if ((bVar1 & 1) != 0) {
    SVOBitset::SVOBitset(&check_d_values,pSVar5);
    iVar3 = HomomorphismModel::pattern_edge_label
                      (this->model,d->v,current_assignment->pattern_vertex);
    while( true ) {
      uVar6 = SVOBitset::find_first(&check_d_values);
      if (uVar6 == 0xffffffff) break;
      SVOBitset::reset(&check_d_values,uVar6);
      iVar4 = HomomorphismModel::target_edge_label
                        (this->model,uVar6,current_assignment->target_vertex);
      if (iVar4 != iVar3) {
        SVOBitset::reset(pSVar5,uVar6);
      }
    }
    SVOBitset::~SVOBitset(&check_d_values);
  }
  return;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}